

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlPushInput(xmlParserCtxtPtr ctxt,xmlParserInputPtr input)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  int *piVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlParserInputPtr input_00;
  int iVar6;
  
  iVar6 = -1;
  if (input != (xmlParserInputPtr)0x0) {
    piVar3 = __xmlParserDebugEntities();
    if (*piVar3 != 0) {
      if ((ctxt->input != (xmlParserInputPtr)0x0) && (ctxt->input->filename != (char *)0x0)) {
        pp_Var4 = __xmlGenericError();
        p_Var1 = *pp_Var4;
        ppvVar5 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar5,"%s(%d): ",ctxt->input->filename,(ulong)(uint)ctxt->input->line);
      }
      pp_Var4 = __xmlGenericError();
      p_Var1 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar5,"Pushing input %d : %.30s\n",(ulong)(ctxt->inputNr + 1),input->cur);
    }
    if ((ctxt->inputNr < 0x29) ||
       (((uint)ctxt->inputNr < 0x401 && ((ctxt->options & 0x80000U) != 0)))) {
      iVar2 = inputPush(ctxt,input);
      if ((ctxt->instate != XML_PARSER_EOF) &&
         ((iVar6 = iVar2, ctxt->progressive == 0 &&
          ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)))) {
        xmlGROW(ctxt);
      }
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
      while (1 < ctxt->inputNr) {
        input_00 = inputPop(ctxt);
        xmlFreeInputStream(input_00);
      }
    }
  }
  return iVar6;
}

Assistant:

int
xmlPushInput(xmlParserCtxtPtr ctxt, xmlParserInputPtr input) {
    int ret;
    if (input == NULL) return(-1);

    if (xmlParserDebugEntities) {
	if ((ctxt->input != NULL) && (ctxt->input->filename))
	    xmlGenericError(xmlGenericErrorContext,
		    "%s(%d): ", ctxt->input->filename,
		    ctxt->input->line);
	xmlGenericError(xmlGenericErrorContext,
		"Pushing input %d : %.30s\n", ctxt->inputNr+1, input->cur);
    }
    if (((ctxt->inputNr > 40) && ((ctxt->options & XML_PARSE_HUGE) == 0)) ||
        (ctxt->inputNr > 1024)) {
        xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
        while (ctxt->inputNr > 1)
            xmlFreeInputStream(inputPop(ctxt));
	return(-1);
    }
    ret = inputPush(ctxt, input);
    if (ctxt->instate == XML_PARSER_EOF)
        return(-1);
    GROW;
    return(ret);
}